

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O1

int __thiscall
ON_BinaryArchive::Read3dmModelGeometryForExperts
          (ON_BinaryArchive *this,bool bManageGeometry,bool bManageAttributes,
          ON_ModelGeometryComponent **model_geometry,uint object_filter)

{
  int iVar1;
  ON_3dmObjectAttributes *this_00;
  ON_Object *geometry_object;
  ON_ModelGeometryComponent *pOVar2;
  ON_Object *p;
  ON_Object *local_38;
  
  if (model_geometry != (ON_ModelGeometryComponent **)0x0) {
    *model_geometry = (ON_ModelGeometryComponent *)0x0;
  }
  local_38 = (ON_Object *)0x0;
  this_00 = (ON_3dmObjectAttributes *)operator_new(0x170);
  ON_3dmObjectAttributes::ON_3dmObjectAttributes(this_00);
  iVar1 = Read3dmObject(this,&local_38,this_00,object_filter);
  geometry_object = &ON_Geometry::Cast(local_38)->super_ON_Object;
  if (geometry_object == (ON_Object *)0x0 || iVar1 != 1) {
    if (local_38 != (ON_Object *)0x0) {
      (*local_38->_vptr_ON_Object[4])();
    }
    (*(this_00->super_ON_Object)._vptr_ON_Object[4])(this_00);
  }
  else {
    pOVar2 = ON_ModelGeometryComponent::CreateForExperts
                       (bManageGeometry,geometry_object,bManageAttributes,this_00,
                        (ON_ModelGeometryComponent *)0x0);
    *model_geometry = pOVar2;
  }
  return iVar1;
}

Assistant:

int ON_BinaryArchive::Read3dmModelGeometryForExperts(
  bool bManageGeometry,
  bool bManageAttributes,
  class ON_ModelGeometryComponent** model_geometry,
  unsigned int object_filter
)
{
  if ( nullptr != model_geometry )
    *model_geometry = nullptr;
  ON_Object* p = nullptr;
  ON_3dmObjectAttributes* attributes = new ON_3dmObjectAttributes();
  int rc = Read3dmObject(&p, attributes, object_filter);
  ON_Geometry* geometry = ON_Geometry::Cast(p);
  if (1 == rc && nullptr != geometry)
  {
    *model_geometry = ON_ModelGeometryComponent::CreateForExperts(bManageGeometry,geometry,bManageAttributes,attributes,nullptr);
  }
  else
  {
    delete p;
    delete attributes;
  }
  return rc;
}